

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh.cpp
# Opt level: O0

void __thiscall polyscope::VolumeMesh::prepare(VolumeMesh *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  long *plVar1;
  ShaderProgram *in_stack_00000098;
  VolumeMesh *in_stack_000000a0;
  shared_ptr<polyscope::render::ShaderProgram> *in_stack_fffffffffffffe48;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe50;
  VolumeMesh *in_stack_fffffffffffffe58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe60;
  allocator_type *in_stack_fffffffffffffe78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe80;
  iterator in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  Engine *in_stack_fffffffffffffe98;
  string *local_158;
  string local_118 [38];
  undefined1 local_f2;
  allocator local_f1;
  string *local_f0;
  string local_e8 [32];
  string *local_c8;
  string *mat;
  ShaderProgram *in_stack_ffffffffffffff48;
  Engine *in_stack_ffffffffffffff50;
  string local_88 [32];
  undefined1 local_68 [47];
  allocator local_39;
  string local_38 [6];
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd0;
  VolumeMesh *in_stack_ffffffffffffffd8;
  undefined1 local_18 [24];
  
  plVar1 = render::engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"MESH",&local_39);
  getMaterial_abi_cxx11_(in_stack_fffffffffffffe58);
  local_f2 = 1;
  local_f0 = local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"MESH_PROPAGATE_TYPE_AND_BASECOLOR2_SHADE",&local_f1);
  local_f2 = 0;
  local_c8 = local_e8;
  mat = (string *)0x1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x4c54ca);
  __l._M_len = (size_type)in_stack_fffffffffffffe90;
  __l._M_array = in_stack_fffffffffffffe88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffe80,__l,in_stack_fffffffffffffe78);
  addVolumeMeshRules(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                     (bool)in_stack_ffffffffffffffcf,(bool)in_stack_ffffffffffffffce);
  render::Engine::addMaterialRules
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffe88);
  (**(code **)(*plVar1 + 0x158))(local_18,plVar1,local_38,local_68,0);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x4c5596);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffe60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffe60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffe60);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x4c55ca);
  local_158 = (string *)&local_c8;
  do {
    local_158 = local_158 + -0x20;
    std::__cxx11::string::~string(local_158);
  } while (local_158 != local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffe50);
  fillGeometryBuffers(in_stack_000000a0,in_stack_00000098);
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffe50);
  getMaterial_abi_cxx11_(in_stack_fffffffffffffe58);
  render::Engine::setMaterial(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,mat);
  std::__cxx11::string::~string(local_118);
  return;
}

Assistant:

void VolumeMesh::prepare() {
  // clang-format off
  program = render::engine->requestShader("MESH", 
      render::engine->addMaterialRules(getMaterial(),
        addVolumeMeshRules(
          {"MESH_PROPAGATE_TYPE_AND_BASECOLOR2_SHADE"}
        )
      )
    );
  // clang-format on
  // Populate draw buffers
  fillGeometryBuffers(*program);
  render::engine->setMaterial(*program, getMaterial());
}